

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O3

void __thiscall icu_63::MeasureUnit::initTime(MeasureUnit *this,char *timeId)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = 0;
  iVar5 = 0x14;
  do {
    while( true ) {
      if (iVar5 <= iVar4) {
        iVar3 = -1;
        goto LAB_0024c281;
      }
      iVar3 = (iVar4 + iVar5) / 2;
      iVar1 = strcmp(*(char **)(gTypes + (long)iVar3 * 8),"duration");
      if (-1 < iVar1) break;
      iVar4 = iVar3 + 1;
    }
    iVar5 = iVar3;
  } while (iVar1 != 0);
LAB_0024c281:
  this->fTypeId = iVar3;
  iVar4 = (&gOffsets)[iVar3];
  iVar5 = iVar4;
  iVar3 = *(int *)(&DAT_002f5ee4 + (long)iVar3 * 4);
  do {
    while( true ) {
      if (iVar3 <= iVar5) {
        iVar1 = -1;
        goto LAB_0024c2e1;
      }
      iVar1 = (iVar3 + iVar5) / 2;
      iVar2 = strcmp(*(char **)(gSubTypes + (long)iVar1 * 8),timeId);
      if (-1 < iVar2) break;
      iVar5 = iVar1 + 1;
    }
    iVar3 = iVar1;
  } while (iVar2 != 0);
LAB_0024c2e1:
  this->fSubTypeId = iVar1 - iVar4;
  return;
}

Assistant:

void MeasureUnit::initTime(const char *timeId) {
    int32_t result = binarySearch(gTypes, 0, UPRV_LENGTHOF(gTypes), "duration");
    U_ASSERT(result != -1);
    fTypeId = result;
    result = binarySearch(gSubTypes, gOffsets[fTypeId], gOffsets[fTypeId + 1], timeId);
    U_ASSERT(result != -1);
    fSubTypeId = result - gOffsets[fTypeId]; 
}